

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_aec.c
# Opt level: O0

int encode_decode_large(test_state *state)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  int iVar3;
  long in_RDI;
  aec_stream *strm;
  size_t to;
  int i;
  int status;
  int local_18;
  int local_4;
  
  puVar1 = *(undefined8 **)(in_RDI + 0x58);
  puVar1[1] = *(undefined8 *)(in_RDI + 0x28);
  puVar1[4] = *(undefined8 *)(in_RDI + 0x38);
  *puVar1 = *(undefined8 *)(in_RDI + 0x10);
  puVar1[3] = *(undefined8 *)(in_RDI + 0x18);
  iVar3 = aec_encode_init(puVar1);
  if (iVar3 == 0) {
    iVar3 = aec_encode(puVar1,1);
    if (iVar3 == 0) {
      aec_encode_end(puVar1);
      puVar1[1] = puVar1[5];
      puVar1[4] = *(undefined8 *)(in_RDI + 0x30);
      *puVar1 = *(undefined8 *)(in_RDI + 0x18);
      puVar1[3] = *(undefined8 *)(in_RDI + 0x20);
      uVar2 = puVar1[5];
      iVar3 = aec_decode_init(puVar1);
      if (iVar3 == 0) {
        iVar3 = aec_decode(puVar1,1);
        if (iVar3 == 0) {
          iVar3 = memcmp(*(void **)(in_RDI + 0x10),*(void **)(in_RDI + 0x20),
                         *(size_t *)(in_RDI + 0x28));
          if (iVar3 == 0) {
            aec_decode_end(puVar1);
            local_4 = 0;
          }
          else {
            printf("\n%s: Uncompressed output differs from input.\n","\x1b[0;31mFAIL\x1b[0m");
            printf("\nuncompressed buf");
            for (local_18 = 0; local_18 < 0x50; local_18 = local_18 + 1) {
              if (local_18 % 8 == 0) {
                printf("\n");
              }
              printf("%02x ",(ulong)*(byte *)(*(long *)(in_RDI + 0x10) + (long)local_18));
            }
            printf("\n\ncompressed buf len %li",uVar2);
            for (local_18 = 0; local_18 < 0x50; local_18 = local_18 + 1) {
              if (local_18 % 8 == 0) {
                printf("\n");
              }
              printf("%02x ",(ulong)*(byte *)(*(long *)(in_RDI + 0x18) + (long)local_18));
            }
            printf("\n\ndecompressed buf");
            for (local_18 = 0; local_18 < 0x50; local_18 = local_18 + 1) {
              if (local_18 % 8 == 0) {
                printf("\n");
              }
              printf("%02x ",(ulong)*(byte *)(*(long *)(in_RDI + 0x20) + (long)local_18));
            }
            printf("\n");
            local_4 = 99;
          }
        }
        else {
          printf("Decode failed.\n");
          local_4 = 99;
        }
      }
      else {
        printf("Init failed.\n");
        local_4 = 99;
      }
    }
    else {
      printf("Encode failed.\n");
      local_4 = 99;
    }
  }
  else {
    printf("Init failed.\n");
    local_4 = 99;
  }
  return local_4;
}

Assistant:

int encode_decode_large(struct test_state *state)
{
    int status, i;
    size_t to;
    struct aec_stream *strm = state->strm;

    strm->avail_in = state->ibuf_len;
    strm->avail_out = state->cbuf_len;
    strm->next_in = state->ubuf;
    strm->next_out = state->cbuf;

    status = aec_encode_init(strm);
    if (status != AEC_OK) {
        printf("Init failed.\n");
        return 99;
    }

    status = aec_encode(strm, AEC_FLUSH);
    if (status != AEC_OK) {
        printf("Encode failed.\n");
        return 99;
    }

    aec_encode_end(strm);

    strm->avail_in = strm->total_out;
    strm->avail_out = state->buf_len;
    strm->next_in = state->cbuf;
    strm->next_out = state->obuf;
    to = strm->total_out;

    status = aec_decode_init(strm);
    if (status != AEC_OK) {
        printf("Init failed.\n");
        return 99;
    }

    status = aec_decode(strm, AEC_FLUSH);
    if (status != AEC_OK) {
        printf("Decode failed.\n");
        return 99;
    }

    if (memcmp(state->ubuf, state->obuf, state->ibuf_len)) {
        printf("\n%s: Uncompressed output differs from input.\n", CHECK_FAIL);

        printf("\nuncompressed buf");
        for (i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n");
            printf("%02x ", state->ubuf[i]);
        }
        printf("\n\ncompressed buf len %li", to);
        for (i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n");
            printf("%02x ", state->cbuf[i]);
        }
        printf("\n\ndecompressed buf");
        for (i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n");
            printf("%02x ", state->obuf[i]);
        }
        printf("\n");
        return 99;
    }
    aec_decode_end(strm);
    return 0;
}